

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O3

int __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::IsTextureCase::init
          (IsTextureCase *this,EVP_PKEY_CTX *ctx)

{
  void *pvVar1;
  bool bVar2;
  int iVar3;
  ContextInfo *ctxInfo;
  RequiredExtensions extensions;
  RequiredExtensions local_48;
  RequiredExtensions local_30;
  ContextType local_14;
  
  ctxInfo = glu::ContextInfo::create(this->m_renderCtx);
  local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_30.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = (*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = isCoreTextureTarget((ContextType *)&local_30,this->m_target);
  if (!bVar2) {
    local_14.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTextureTargetExtension(&local_30,&local_14,this->m_target);
    RequiredExtensions::add(&local_48,&local_30);
    pvVar1 = (void *)CONCAT44(local_30.m_extensions.
                              super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                              _M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)local_30.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_30.m_extensions.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1)
      ;
    }
  }
  RequiredExtensions::check(&local_48,ctxInfo);
  if (local_48.m_extensions.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.m_extensions.
                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.m_extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.m_extensions.
                          super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  iVar3 = (*ctxInfo->_vptr_ContextInfo[1])(ctxInfo);
  return iVar3;
}

Assistant:

void IsTextureCase::init (void)
{
	const de::UniquePtr<glu::ContextInfo>	ctxInfo		(glu::ContextInfo::create(m_renderCtx));
	RequiredExtensions						extensions;

	// target
	if (!isCoreTextureTarget(m_renderCtx.getType(), m_target))
		extensions.add(getTextureTargetExtension(m_renderCtx.getType(), m_target));

	extensions.check(*ctxInfo);
}